

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void truncate<dense_parameters>(vw *all,dense_parameters *weights)

{
  int iVar1;
  dense_parameters *in_stack_000000c8;
  vw *in_stack_000000d0;
  dense_parameters *in_stack_ffffffffffffff80;
  
  if (truncate<dense_parameters>(vw&,dense_parameters&)::sd == '\0') {
    iVar1 = __cxa_guard_acquire(&truncate<dense_parameters>(vw&,dense_parameters&)::sd);
    if (iVar1 != 0) {
      truncate<dense_parameters>::sd =
           calculate_sd<dense_parameters>(in_stack_000000d0,in_stack_000000c8);
      __cxa_guard_release(&truncate<dense_parameters>(vw&,dense_parameters&)::sd);
    }
  }
  dense_parameters::begin(in_stack_ffffffffffffff80);
  dense_parameters::end(in_stack_ffffffffffffff80);
  std::
  for_each<dense_iterator<float>,truncate<dense_parameters>(vw&,dense_parameters&)::_lambda(float&)_1_>
            ();
  return;
}

Assistant:

void truncate(vw& all, T& weights)
{
  static double sd = calculate_sd(all, weights);
  for_each(weights.begin(), weights.end(), [](float& v) {
    if (abs(v) > sd * 2)
    {
      v = (float)std::remainder(v, sd * 2);
    }
  });
}